

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crl.c
# Opt level: O3

void mbedtls_x509_crl_free(mbedtls_x509_crl *crl)

{
  mbedtls_x509_crl **ppmVar1;
  mbedtls_asn1_named_data *pmVar2;
  mbedtls_x509_crl_entry *pmVar3;
  size_t sVar4;
  mbedtls_asn1_named_data *__ptr;
  mbedtls_x509_crl_entry *__ptr_00;
  long lVar5;
  size_t sVar6;
  mbedtls_x509_crl *crl_cur;
  uchar *__ptr_01;
  mbedtls_x509_crl *pmVar7;
  mbedtls_x509_crl *__ptr_02;
  
  pmVar7 = crl;
  if (crl != (mbedtls_x509_crl *)0x0) {
    do {
      free(pmVar7->sig_opts);
      __ptr = (pmVar7->issuer).next;
      while (__ptr != (mbedtls_asn1_named_data *)0x0) {
        pmVar2 = __ptr->next;
        lVar5 = 0;
        do {
          *(undefined1 *)((long)&(__ptr->oid).tag + lVar5) = 0;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x40);
        free(__ptr);
        __ptr = pmVar2;
      }
      __ptr_00 = (pmVar7->entry).next;
      while (__ptr_00 != (mbedtls_x509_crl_entry *)0x0) {
        pmVar3 = __ptr_00->next;
        lVar5 = 0;
        do {
          *(undefined1 *)((long)&(__ptr_00->raw).tag + lVar5) = 0;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x68);
        free(__ptr_00);
        __ptr_00 = pmVar3;
      }
      __ptr_01 = (pmVar7->raw).p;
      if (__ptr_01 != (uchar *)0x0) {
        sVar4 = (pmVar7->raw).len;
        if (sVar4 != 0) {
          sVar6 = 0;
          do {
            __ptr_01[sVar6] = '\0';
            sVar6 = sVar6 + 1;
          } while (sVar4 != sVar6);
          __ptr_01 = (pmVar7->raw).p;
        }
        free(__ptr_01);
      }
      ppmVar1 = &pmVar7->next;
      __ptr_02 = crl;
      pmVar7 = *ppmVar1;
    } while (*ppmVar1 != (mbedtls_x509_crl *)0x0);
    do {
      pmVar7 = __ptr_02->next;
      lVar5 = 0;
      do {
        *(undefined1 *)((long)&(__ptr_02->raw).tag + lVar5) = 0;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x1a0);
      if (__ptr_02 != crl) {
        free(__ptr_02);
      }
      __ptr_02 = pmVar7;
    } while (pmVar7 != (mbedtls_x509_crl *)0x0);
  }
  return;
}

Assistant:

void mbedtls_x509_crl_free( mbedtls_x509_crl *crl )
{
    mbedtls_x509_crl *crl_cur = crl;
    mbedtls_x509_crl *crl_prv;
    mbedtls_x509_name *name_cur;
    mbedtls_x509_name *name_prv;
    mbedtls_x509_crl_entry *entry_cur;
    mbedtls_x509_crl_entry *entry_prv;

    if( crl == NULL )
        return;

    do
    {
#if defined(MBEDTLS_X509_RSASSA_PSS_SUPPORT)
        mbedtls_free( crl_cur->sig_opts );
#endif

        name_cur = crl_cur->issuer.next;
        while( name_cur != NULL )
        {
            name_prv = name_cur;
            name_cur = name_cur->next;
            mbedtls_zeroize( name_prv, sizeof( mbedtls_x509_name ) );
            mbedtls_free( name_prv );
        }

        entry_cur = crl_cur->entry.next;
        while( entry_cur != NULL )
        {
            entry_prv = entry_cur;
            entry_cur = entry_cur->next;
            mbedtls_zeroize( entry_prv, sizeof( mbedtls_x509_crl_entry ) );
            mbedtls_free( entry_prv );
        }

        if( crl_cur->raw.p != NULL )
        {
            mbedtls_zeroize( crl_cur->raw.p, crl_cur->raw.len );
            mbedtls_free( crl_cur->raw.p );
        }

        crl_cur = crl_cur->next;
    }
    while( crl_cur != NULL );

    crl_cur = crl;
    do
    {
        crl_prv = crl_cur;
        crl_cur = crl_cur->next;

        mbedtls_zeroize( crl_prv, sizeof( mbedtls_x509_crl ) );
        if( crl_prv != crl )
            mbedtls_free( crl_prv );
    }
    while( crl_cur != NULL );
}